

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void gimage::imageSelect<float,gimage::PixelTraits<float>>
               (Image<float,_gimage::PixelTraits<float>_> *ret,
               Image<float,_gimage::PixelTraits<float>_> *image,int j)

{
  long lVar1;
  int in_EDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  store_t_conflict v;
  Image<float,_gimage::PixelTraits<float>_> *unaff_retaddr;
  long i;
  long k;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 in_stack_ffffffffffffffe8;
  Image<float,_gimage::PixelTraits<float>_> *pIVar2;
  
  Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (unaff_retaddr,(long)in_RDI,(long)in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  local_20 = 0;
  while( true ) {
    lVar1 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
    if (lVar1 <= local_20) break;
    local_28 = 0;
    while( true ) {
      lVar1 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
      if (lVar1 <= local_28) break;
      pIVar2 = in_RDI;
      v = Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,local_28,local_20,in_EDX);
      Image<float,_gimage::PixelTraits<float>_>::set(in_RDI,local_28,local_20,0,v);
      local_28 = local_28 + 1;
      in_RDI = pIVar2;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void imageSelect(Image<T, traits> &ret, const Image<T, traits> &image, int j)
{
  ret.setSize(image.getWidth(), image.getHeight(), 1);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, j));
    }
  }
}